

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void Imf_3_3::anon_unknown_7::bufferedTileWrite
               (Data *ofd,int dx,int dy,int lx,int ly,char *pixelData,uint64_t pixelDataSize,
               uint64_t unpackedDataSize,char *sampleCountTableData,uint64_t sampleCountTableSize)

{
  bool bVar1;
  uint64_t *puVar2;
  ostream *poVar3;
  undefined8 uVar4;
  pointer_conflict ppVar5;
  BufferedTile *pBVar6;
  mapped_type_conflict *ppBVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  TileCoord TVar8;
  map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
  *in_stack_00000008;
  iterator i;
  stringstream _iex_throw_s_1;
  TileCoord currentTile;
  stringstream _iex_throw_s;
  stringstream *in_stack_fffffffffffffb58;
  ArgExc *in_stack_fffffffffffffb60;
  map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
  *this;
  char *in_stack_fffffffffffffb68;
  iterator __position;
  undefined8 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  undefined8 in_stack_fffffffffffffb80;
  TileOffsets *in_stack_fffffffffffffb88;
  long lVar9;
  undefined4 in_stack_fffffffffffffb90;
  int iVar10;
  undefined4 in_stack_fffffffffffffb94;
  int iVar11;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
  *in_stack_fffffffffffffba0;
  char *pixelDataSize_00;
  uint64_t in_stack_fffffffffffffba8;
  char *in_stack_fffffffffffffbb0;
  BufferedTile *in_stack_fffffffffffffbb8;
  undefined8 local_3a8;
  undefined8 local_3a0;
  _Self local_388;
  _Self local_380;
  TileCoord local_378;
  stringstream local_368 [16];
  ostream local_358 [112];
  TileCoord *in_stack_fffffffffffffd18;
  Data *in_stack_fffffffffffffd20;
  _Self local_1e0;
  _Self local_1d8;
  TileCoord local_1cc;
  stringstream local_1b0 [16];
  ostream local_1a0 [384];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  puVar2 = TileOffsets::operator()
                     (in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                      (int)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,
                      in_stack_fffffffffffffb78);
  if (*puVar2 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar3 = std::operator<<(local_1a0,"Attempt to write tile (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    std::operator<<(poVar3,") more than once.");
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if (*(int *)(local_10 + 0xc0) == 2) {
    writeTileData((Data *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                  (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(int)in_stack_fffffffffffffb88,
                  (int)((ulong)in_stack_fffffffffffffb80 >> 0x20),(int)in_stack_fffffffffffffb80,
                  (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                  (uint64_t)in_stack_fffffffffffffba0,in_stack_fffffffffffffba8,
                  in_stack_fffffffffffffbb0,(uint64_t)in_stack_fffffffffffffbb8);
  }
  else {
    TileCoord::TileCoord((TileCoord *)&local_1cc,local_14,local_18,local_1c,local_20);
    local_1d8._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
         ::find((map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
                 *)in_stack_fffffffffffffb58,(key_type *)0x1bba2b);
    local_1e0._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
         ::end((map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
                *)in_stack_fffffffffffffb58);
    bVar1 = std::operator!=(&local_1d8,&local_1e0);
    if (bVar1) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_368);
      poVar3 = std::operator<<(local_358,"Attempt to write tile (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
      std::operator<<(poVar3,") more than once.");
      uVar4 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    bVar1 = TileCoord::operator==((TileCoord *)(local_10 + 0x188),&local_1cc);
    iVar10 = (int)((ulong)in_stack_fffffffffffffb60 >> 0x20);
    if (bVar1) {
      writeTileData((Data *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                    (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(int)in_stack_fffffffffffffb88,
                    (int)((ulong)in_stack_fffffffffffffb80 >> 0x20),(int)in_stack_fffffffffffffb80,
                    (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                    (uint64_t)in_stack_fffffffffffffba0,in_stack_fffffffffffffba8,
                    in_stack_fffffffffffffbb0,(uint64_t)in_stack_fffffffffffffbb8);
      local_378 = DeepTiledOutputFile::Data::nextTileCoord
                            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      *(undefined8 *)(local_10 + 0x188) = local_378._0_8_;
      *(undefined8 *)(local_10 + 400) = local_378._8_8_;
      local_380._M_node =
           (_Base_ptr)
           std::
           map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
           ::find(in_stack_00000008,(key_type *)0x1bbd01);
      while( true ) {
        local_388._M_node =
             (_Base_ptr)
             std::
             map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
             ::end(in_stack_00000008);
        bVar1 = std::operator!=(&local_380,&local_388);
        if (!bVar1) break;
        lVar9 = local_10;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x1bbd5d);
        iVar10 = (ppVar5->first).dx;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x1bbd70);
        iVar11 = (ppVar5->first).dy;
        std::
        _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                      *)0x1bbd84);
        std::
        _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                      *)0x1bbd98);
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x1bbdac);
        pixelDataSize_00 = ppVar5->second->pixelData;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x1bbdc5);
        in_stack_00000008 =
             (map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
              *)ppVar5->second->pixelDataSize;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x1bbdda);
        this = (map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
                *)ppVar5->second->unpackedDataSize;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x1bbdf4);
        __position._M_node = (_Base_ptr)ppVar5->second->sampleCountTableData;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x1bbe0e);
        pBVar6 = (BufferedTile *)ppVar5->second->sampleCountTableSize;
        writeTileData((Data *)CONCAT44(iVar11,iVar10),(int)((ulong)lVar9 >> 0x20),(int)lVar9,
                      (int)((ulong)in_stack_fffffffffffffb80 >> 0x20),(int)in_stack_fffffffffffffb80
                      ,(char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                      (uint64_t)pixelDataSize_00,(uint64_t)this,(char *)__position._M_node,
                      (uint64_t)in_stack_fffffffffffffbb8);
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x1bbe60);
        in_stack_fffffffffffffbb8 = ppVar5->second;
        if (in_stack_fffffffffffffbb8 != (BufferedTile *)0x0) {
          BufferedTile::~BufferedTile(pBVar6);
          operator_delete(in_stack_fffffffffffffbb8,0x28);
        }
        std::
        map<Imf_3_3::(anonymous_namespace)::TileCoord,Imf_3_3::(anonymous_namespace)::BufferedTile*,std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,std::allocator<std::pair<Imf_3_3::(anonymous_namespace)::TileCoord_const,Imf_3_3::(anonymous_namespace)::BufferedTile*>>>
        ::erase_abi_cxx11_(this,__position);
        TVar8 = DeepTiledOutputFile::Data::nextTileCoord
                          (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        local_3a8 = TVar8._0_8_;
        *(undefined8 *)(local_10 + 0x188) = local_3a8;
        local_3a0 = TVar8._8_8_;
        *(undefined8 *)(local_10 + 400) = local_3a0;
        local_380._M_node =
             (_Base_ptr)
             std::
             map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
             ::find(in_stack_00000008,(key_type *)0x1bbf31);
      }
    }
    else {
      pBVar6 = (BufferedTile *)operator_new(0x28);
      BufferedTile::BufferedTile
                (pBVar6,(char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                 (int)((ulong)in_stack_fffffffffffffb70 >> 0x20),(int)in_stack_fffffffffffffb70,
                 in_stack_fffffffffffffb68,iVar10);
      ppBVar7 = std::
                map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
                ::operator[](in_stack_fffffffffffffba0,
                             (key_type *)
                             CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      *ppBVar7 = pBVar6;
    }
  }
  return;
}

Assistant:

void
bufferedTileWrite (
    DeepTiledOutputFile::Data* ofd,
    int                        dx,
    int                        dy,
    int                        lx,
    int                        ly,
    const char                 pixelData[],
    uint64_t                   pixelDataSize,
    uint64_t                   unpackedDataSize,
    const char                 sampleCountTableData[],
    uint64_t                   sampleCountTableSize)
{
    //
    // Check if a tile with coordinates (dx,dy,lx,ly) has already been written.
    //

    if (ofd->tileOffsets (dx, dy, lx, ly))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Attempt to write tile "
            "(" << dx
                << ", " << dy << ", " << lx << ", " << ly
                << ") "
                   "more than once.");
    }

    //
    // If tiles can be written in random order, then don't buffer anything.
    //

    if (ofd->lineOrder == RANDOM_Y)
    {
        writeTileData (
            ofd,
            dx,
            dy,
            lx,
            ly,
            pixelData,
            pixelDataSize,
            unpackedDataSize,
            sampleCountTableData,
            sampleCountTableSize);
        return;
    }

    //
    // If the tiles cannot be written in random order, then check if a
    // tile with coordinates (dx,dy,lx,ly) has already been buffered.
    //

    TileCoord currentTile = TileCoord (dx, dy, lx, ly);

    if (ofd->tileMap.find (currentTile) != ofd->tileMap.end ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Attempt to write tile "
            "(" << dx
                << ", " << dy << ", " << lx << ", " << ly
                << ") "
                   "more than once.");
    }

    //
    // If all the tiles before this one have already been written to the file,
    // then write this tile immediately and check if we have buffered tiles
    // that can be written after this tile.
    //
    // Otherwise, buffer the tile so it can be written to file later.
    //

    if (ofd->nextTileToWrite == currentTile)
    {
        writeTileData (
            ofd,
            dx,
            dy,
            lx,
            ly,
            pixelData,
            pixelDataSize,
            unpackedDataSize,
            sampleCountTableData,
            sampleCountTableSize);
        ofd->nextTileToWrite = ofd->nextTileCoord (ofd->nextTileToWrite);

        TileMap::iterator i = ofd->tileMap.find (ofd->nextTileToWrite);

        //
        // Step through the tiles and write all successive buffered tiles after
        // the current one.
        //

        while (i != ofd->tileMap.end ())
        {
            //
            // Write the tile, and then delete the tile's buffered data
            //

            writeTileData (
                ofd,
                i->first.dx,
                i->first.dy,
                i->first.lx,
                i->first.ly,
                i->second->pixelData,
                i->second->pixelDataSize,
                i->second->unpackedDataSize,
                i->second->sampleCountTableData,
                i->second->sampleCountTableSize);

            delete i->second;
            ofd->tileMap.erase (i);

            //
            // Proceed to the next tile
            //

            ofd->nextTileToWrite = ofd->nextTileCoord (ofd->nextTileToWrite);
            i                    = ofd->tileMap.find (ofd->nextTileToWrite);
        }
    }
    else
    {
        //
        // Create a new BufferedTile, copy the pixelData into it, and
        // insert it into the tileMap.
        //

        ofd->tileMap[currentTile] = new BufferedTile (
            (const char*) pixelData,
            static_cast<int> (pixelDataSize),
            static_cast<int> (unpackedDataSize),
            sampleCountTableData,
            static_cast<int> (sampleCountTableSize));
    }
}